

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  VectorXd *this;
  double dVar1;
  pointer pMVar2;
  double *__ptr;
  char cVar3;
  int iVar4;
  double *__tmp;
  istream *piVar5;
  pointer pMVar6;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar7;
  double *pdVar8;
  Scalar *pSVar9;
  ostream *poVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float y_gt;
  float x_gt;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ground_truth;
  float ro;
  float x;
  double local_6e0;
  float local_6d4;
  Tools tools;
  longlong timestamp;
  float vy_gt;
  float vx_gt;
  vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> measurement_pack_list;
  GroundTruthPackage gt_package;
  vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> gt_pack_list;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  estimations;
  string out_file_name_;
  string line;
  string in_file_name_;
  FusionEKF fusionEKF;
  ofstream out_file_;
  ifstream in_file_;
  
  check_arguments(argc,argv);
  std::__cxx11::string::string((string *)&in_file_name_,argv[1],(allocator *)&in_file_);
  std::ifstream::ifstream(&in_file_,in_file_name_._M_dataplus._M_p,_S_in);
  std::__cxx11::string::string((string *)&out_file_name_,argv[2],(allocator *)&out_file_);
  std::ofstream::ofstream(&out_file_,out_file_name_._M_dataplus._M_p,_S_out);
  check_files(&in_file_,&in_file_name_,&out_file_,&out_file_name_);
  measurement_pack_list.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gt_pack_list.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  measurement_pack_list.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  measurement_pack_list.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gt_pack_list.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gt_pack_list.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  lVar11 = 0x10;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&in_file_,(string *)&line);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    estimations.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&estimations.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    estimations.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    estimations.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)estimations.
                          super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    ground_truth.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = (double *)0x0;
    gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 0;
    std::__cxx11::istringstream::istringstream((istringstream *)&fusionEKF,(string *)&line,_S_in);
    std::operator>>((istream *)&fusionEKF,(string *)&estimations);
    iVar4 = std::__cxx11::string::compare((char *)&estimations);
    if (iVar4 == 0) {
      ground_truth.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)ground_truth.
                            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      pMVar6 = (pointer)Eigen::internal::aligned_malloc(0x10);
      pMVar2 = ground_truth.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ground_truth.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar6;
      free(pMVar2);
      std::istream::_M_extract<float>((float *)&fusionEKF);
      std::istream::_M_extract<float>((float *)&fusionEKF);
      tools._vptr_Tools =
           (_func_int **)
           &ground_truth.
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ((ground_truth.
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           (double *)(double)x;
      local_6e0 = (double)ro;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools,&local_6e0);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools);
      std::istream::_M_extract<long_long>((longlong *)&fusionEKF);
      std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                (&measurement_pack_list,(value_type *)&ground_truth);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&estimations);
      if (iVar4 == 0) {
        ground_truth.
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(ground_truth.
                               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
        pMVar6 = (pointer)Eigen::internal::aligned_malloc(0x18);
        pMVar2 = ground_truth.
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ground_truth.
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar6;
        free(pMVar2);
        std::istream::_M_extract<float>((float *)&fusionEKF);
        std::istream::_M_extract<float>((float *)&fusionEKF);
        std::istream::_M_extract<float>((float *)&fusionEKF);
        tools._vptr_Tools =
             (_func_int **)
             &ground_truth.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ((ground_truth.
          super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             (double *)(double)ro;
        local_6e0 = (double)x_gt;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools,
                            &local_6e0);
        _x = (double)y_gt;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar7,(Scalar *)&x);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                  ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools);
        std::istream::_M_extract<long_long>((longlong *)&fusionEKF);
        std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                  (&measurement_pack_list,(value_type *)&ground_truth);
      }
    }
    std::istream::_M_extract<float>((float *)&fusionEKF);
    std::istream::_M_extract<float>((float *)&fusionEKF);
    std::istream::_M_extract<float>((float *)&fusionEKF);
    std::istream::_M_extract<float>((float *)&fusionEKF);
    pdVar8 = (double *)Eigen::internal::aligned_malloc(0x20);
    __ptr = gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
    gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = 4;
    gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = pdVar8;
    free(__ptr);
    tools._vptr_Tools = (_func_int **)&gt_package.gt_values_;
    *gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
     m_data = (double)x_gt;
    local_6e0 = (double)y_gt;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools,
                        &local_6e0);
    _x = (double)vx_gt;
    pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar7,(Scalar *)&x);
    _ro = (double)vy_gt;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar7,(Scalar *)&ro);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools);
    std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::push_back
              (&gt_pack_list,&gt_package);
    std::__cxx11::istringstream::~istringstream((istringstream *)&fusionEKF);
    free(gt_package.gt_values_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(ground_truth.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&estimations);
  }
  FusionEKF::FusionEKF(&fusionEKF);
  estimations.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  estimations.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  estimations.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ground_truth.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ground_truth.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ground_truth.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar12 = (long)measurement_pack_list.
                 super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)measurement_pack_list.
                 super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl
                 .super__Vector_impl_data._M_start >> 5;
  this = &fusionEKF.ekf_.x_;
  while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
    FusionEKF::ProcessMeasurement
              (&fusionEKF,
               (MeasurementPackage *)
               ((long)measurement_pack_list.
                      super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar11 + -0x10));
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\t");
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\t");
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,2);
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\t");
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,3);
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\t");
    iVar4 = *(int *)((long)measurement_pack_list.
                           super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
    if (iVar4 == 1) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          ((long)&(measurement_pack_list.
                                   super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),
                          0);
      local_6d4 = (float)*pSVar9;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          ((long)&(measurement_pack_list.
                                   super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),
                          1);
      dVar1 = *pSVar9;
      fVar14 = cosf((float)dVar1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&out_file_,fVar14 * local_6d4);
      std::operator<<(poVar10,"\t");
      fVar14 = sinf((float)dVar1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&out_file_,fVar14 * local_6d4);
      std::operator<<(poVar10,"\t");
    }
    else if (iVar4 == 0) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          ((long)&(measurement_pack_list.
                                   super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),
                          0);
      poVar10 = std::ostream::_M_insert<double>(*pSVar9);
      std::operator<<(poVar10,"\t");
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          ((long)&(measurement_pack_list.
                                   super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),
                          1);
      poVar10 = std::ostream::_M_insert<double>(*pSVar9);
      std::operator<<(poVar10,"\t");
    }
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        ((long)&(gt_pack_list.
                                 super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),0)
    ;
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\t");
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        ((long)&(gt_pack_list.
                                 super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),1)
    ;
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\t");
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        ((long)&(gt_pack_list.
                                 super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),2)
    ;
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\t");
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        ((long)&(gt_pack_list.
                                 super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11),3)
    ;
    poVar10 = std::ostream::_M_insert<double>(*pSVar9);
    std::operator<<(poVar10,"\n");
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&estimations,this);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&ground_truth,
                (value_type *)
                ((long)&(gt_pack_list.
                         super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                         ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar11));
    lVar11 = lVar11 + 0x20;
  }
  Tools::Tools(&tools);
  poVar10 = std::operator<<((ostream *)&std::cout,"Accuracy - RMSE:");
  poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
  Tools::CalculateRMSE
            ((Tools *)&gt_package,
             (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&tools,&estimations);
  poVar10 = Eigen::operator<<(poVar10,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                      &gt_package);
  std::endl<char,std::char_traits<char>>(poVar10);
  free((void *)gt_package.timestamp_);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ofstream::close();
  }
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::ifstream::close();
  }
  Tools::~Tools(&tools);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&ground_truth);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&estimations);
  FusionEKF::~FusionEKF(&fusionEKF);
  std::__cxx11::string::~string((string *)&line);
  std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::~vector(&gt_pack_list);
  std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::~vector
            (&measurement_pack_list);
  std::ofstream::~ofstream(&out_file_);
  std::__cxx11::string::~string((string *)&out_file_name_);
  std::ifstream::~ifstream(&in_file_);
  std::__cxx11::string::~string((string *)&in_file_name_);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {

  check_arguments(argc, argv);

  string in_file_name_ = argv[1];
  ifstream in_file_(in_file_name_.c_str(), ifstream::in);

  string out_file_name_ = argv[2];
  ofstream out_file_(out_file_name_.c_str(), ofstream::out);

  check_files(in_file_, in_file_name_, out_file_, out_file_name_);

  vector<MeasurementPackage> measurement_pack_list;
  vector<GroundTruthPackage> gt_pack_list;

  string line;

  // prep the measurement packages (each line represents a measurement at a
  // timestamp)
  while (getline(in_file_, line)) {

    string sensor_type;
    MeasurementPackage meas_package;
    GroundTruthPackage gt_package;
    istringstream iss(line);
    long long timestamp;

    // reads first element from the current line
    iss >> sensor_type;
    if (sensor_type.compare("L") == 0) {
      // LASER MEASUREMENT

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::LASER;
      meas_package.raw_measurements_ = VectorXd(2);
      float x;
      float y;
      iss >> x;
      iss >> y;
      meas_package.raw_measurements_ << x, y;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    } else if (sensor_type.compare("R") == 0) {
      // RADAR MEASUREMENT

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::RADAR;
      meas_package.raw_measurements_ = VectorXd(3);
      float ro;
      float theta;
      float ro_dot;
      iss >> ro;
      iss >> theta;
      iss >> ro_dot;
      meas_package.raw_measurements_ << ro, theta, ro_dot;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    }

    // read ground truth data to compare later
    float x_gt;
    float y_gt;
    float vx_gt;
    float vy_gt;
    iss >> x_gt;
    iss >> y_gt;
    iss >> vx_gt;
    iss >> vy_gt;
    gt_package.gt_values_ = VectorXd(4);
    gt_package.gt_values_ << x_gt, y_gt, vx_gt, vy_gt;
    gt_pack_list.push_back(gt_package);
  }

  // Create a Fusion EKF instance
  FusionEKF fusionEKF;

  // used to compute the RMSE later
  vector<VectorXd> estimations;
  vector<VectorXd> ground_truth;

  //Call the EKF-based fusion
  size_t N = measurement_pack_list.size();
  for (size_t k = 0; k < N; ++k) {
    // start filtering from the second frame (the speed is unknown in the first
    // frame)
    fusionEKF.ProcessMeasurement(measurement_pack_list[k]);

    // output the estimation
    out_file_ << fusionEKF.ekf_.x_(0) << "\t";
    out_file_ << fusionEKF.ekf_.x_(1) << "\t";
    out_file_ << fusionEKF.ekf_.x_(2) << "\t";
    out_file_ << fusionEKF.ekf_.x_(3) << "\t";

    // output the measurements
    if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::LASER) {
      // output the estimation
      out_file_ << measurement_pack_list[k].raw_measurements_(0) << "\t";
      out_file_ << measurement_pack_list[k].raw_measurements_(1) << "\t";
    } else if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::RADAR) {
      // output the estimation in the cartesian coordinates
      float ro = measurement_pack_list[k].raw_measurements_(0);
      float phi = measurement_pack_list[k].raw_measurements_(1);
      out_file_ << ro * cos(phi) << "\t"; // p1_meas
      out_file_ << ro * sin(phi) << "\t"; // ps_meas
    }

    // output the ground truth packages
    out_file_ << gt_pack_list[k].gt_values_(0) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(1) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(2) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(3) << "\n";

    estimations.push_back(fusionEKF.ekf_.x_);
    ground_truth.push_back(gt_pack_list[k].gt_values_);
  }

  // compute the accuracy (RMSE)
  Tools tools;
  cout << "Accuracy - RMSE:" << endl << tools.CalculateRMSE(estimations, ground_truth) << endl;

  // close files
  if (out_file_.is_open()) {
    out_file_.close();
  }

  if (in_file_.is_open()) {
    in_file_.close();
  }

  return 0;
}